

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_3,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::negate<float,3,4>
          (Matrix<float,_3,_4> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_3,_4> *mat)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_24;
  undefined4 local_20;
  int c;
  int r;
  Matrix<float,_3,_4> *mat_local;
  Matrix<float,_3,_4> *retVal;
  
  tcu::Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      pfVar2 = tcu::Matrix<float,_3,_4>::operator()((Matrix<float,_3,_4> *)this,local_20,local_24);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Matrix<float,_3,_4>::operator()(__return_storage_ptr__,local_20,local_24);
      *pfVar2 = -fVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> negate (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = -mat(r, c);

	return retVal;
}